

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

aiNode * __thiscall aiNode::FindNode(aiNode *this,char *name)

{
  uint uVar1;
  aiNode **ppaVar2;
  int iVar3;
  aiNode *paVar4;
  ulong uVar5;
  
  iVar3 = strcmp((this->mName).data,name);
  if (iVar3 != 0) {
    uVar1 = this->mNumChildren;
    if ((ulong)uVar1 == 0) {
      this = (aiNode *)0x0;
    }
    else {
      ppaVar2 = this->mChildren;
      this = (aiNode *)0x0;
      uVar5 = 0;
      do {
        paVar4 = FindNode(ppaVar2[uVar5],name);
        if (paVar4 != (aiNode *)0x0) {
          return paVar4;
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  return this;
}

Assistant:

aiNode *aiNode::FindNode(const char* name) {
    if (!::strcmp(mName.data, name))return this;
    for (unsigned int i = 0; i < mNumChildren; ++i)
    {
        aiNode* const p = mChildren[i]->FindNode(name);
        if (p) {
            return p;
        }
    }
    // there is definitely no sub-node with this name
    return nullptr;
}